

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O3

InlineeFrameRecord * __thiscall InlineeFrameRecord::Reverse(InlineeFrameRecord *this)

{
  InlineeFrameRecord *pIVar1;
  InlineeFrameRecord *pIVar2;
  InlineeFrameRecord *pIVar3;
  
  pIVar3 = (InlineeFrameRecord *)0x0;
  do {
    pIVar2 = this;
    pIVar1 = this->parent;
    this->parent = pIVar3;
    pIVar3 = this;
    this = pIVar1;
  } while (pIVar1 != (InlineeFrameRecord *)0x0);
  return pIVar2;
}

Assistant:

InlineeFrameRecord* InlineeFrameRecord::Reverse()
{
    InlineeFrameRecord * prev = nullptr;
    InlineeFrameRecord * current = this;
    while (current)
    {
        InlineeFrameRecord * next = current->parent;
        current->parent = prev;
        prev = current;
        current = next;
    }
    return prev;
}